

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Button.cpp
# Opt level: O1

void __thiscall gui::Button::handleMouseRelease(Button *this,Button button,Vector2f *mouseParent)

{
  Vector2f VVar1;
  Transform *this_00;
  Vector2f *pVVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector2f mouseLocal;
  Vector2<float> local_30;
  undefined1 local_28 [16];
  
  this_00 = Widget::getInverseTransform(&this->super_Widget);
  VVar1 = sf::Transform::transformPoint(this_00,mouseParent);
  local_28._8_4_ = extraout_XMM0_Dc;
  local_28._0_4_ = VVar1.x;
  local_28._4_4_ = VVar1.y;
  local_28._12_4_ = extraout_XMM0_Dd;
  pVVar2 = Widget::getOrigin(&this->super_Widget);
  local_30.y = (float)local_28._4_4_ - (*pVVar2).y;
  local_30.x = (float)local_28._0_4_ - (*pVVar2).x;
  if (((int)button < 3) && (this->isPressed_ == true)) {
    this->isPressed_ = false;
    Widget::requestRedraw(&this->super_Widget);
    Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
              (&this->onClick,&this->super_Widget,&local_30);
  }
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            (&this->onMouseRelease,&this->super_Widget,button,&local_30);
  Widget::handleMouseRelease(&this->super_Widget,button,mouseParent);
  return;
}

Assistant:

void Button::handleMouseRelease(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button <= sf::Mouse::Middle && isPressed_) {
        setPressed(false);
        onClick.emit(this, mouseLocal);
    }
    onMouseRelease.emit(this, button, mouseLocal);
    baseClass::handleMouseRelease(button, mouseParent);
}